

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

int Ndr_ObjReadRange(Ndr_Data_t *p,int Obj,int *End,int *Beg)

{
  byte bVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint *puVar7;
  
  iVar5 = Obj + 1;
  puVar2 = p->pBody;
  if (iVar5 < (int)(puVar2[Obj] + Obj)) {
    puVar6 = (uint *)0x0;
    puVar7 = (uint *)0x0;
    iVar3 = 0;
    do {
      bVar1 = p->pHead[iVar5];
      if (bVar1 == 8) {
        iVar3 = iVar3 + 1;
        uVar4 = 1;
        puVar7 = puVar6;
        if (puVar6 == (uint *)0x0) {
          puVar6 = puVar2 + iVar5;
          puVar7 = puVar6;
        }
      }
      else {
        if (bVar1 == 0) {
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
        if (puVar7 != (uint *)0x0) break;
        if (bVar1 < 4) {
          uVar4 = puVar2[iVar5];
        }
        else {
          uVar4 = 1;
        }
        puVar7 = (uint *)0x0;
      }
      iVar5 = iVar5 + uVar4;
    } while (iVar5 < (int)(puVar2[Obj] + Obj));
    *Beg = 0;
    *End = 0;
    if (iVar3 != 0) {
      if (iVar3 == 3) {
        iVar3 = 1;
      }
      else {
        if (iVar3 == 1) {
          uVar4 = *puVar6;
          *Beg = uVar4;
          *End = uVar4;
          return 0;
        }
        iVar3 = 0;
      }
      *End = *puVar6;
      *Beg = puVar6[1];
    }
  }
  else {
    iVar3 = 0;
    *Beg = 0;
    *End = 0;
  }
  return iVar3;
}

Assistant:

int Ndr_ObjReadRange( Ndr_Data_t * p, int Obj, int * End, int * Beg )
{
    int * pArray, nArray = Ndr_ObjReadArray( p, Obj, NDR_RANGE, &pArray );
    int Signed = 0; *End = *Beg = 0;
    if ( nArray == 0 )
        return 0;
    if ( nArray == 3 )
        Signed = 1;
    if ( nArray == 1 )
        *End = *Beg = pArray[0];
    else
        *End = pArray[0], *Beg = pArray[1];
    return Signed;
}